

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::TexImageCubeArrayDepthBufferCase::createTexture
          (TexImageCubeArrayDepthBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  int iVar1;
  int iVar2;
  TransferFormat TVar3;
  uint rowPitch;
  int slicePitch;
  deUint32 buf;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 local_78;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  this_01 = &(this->super_TextureCubeArraySpecCase).m_texFormat;
  TVar3 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  iVar2 = tcu::TextureFormat::getPixelSize(this_01);
  iVar1 = (this->super_TextureCubeArraySpecCase).m_size;
  rowPitch = iVar2 * iVar1 + 3U & 0xfffffffc;
  slicePitch = rowPitch * iVar1;
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->super_TextureCubeArraySpecCase).m_depth * slicePitch));
  local_68.m_data[0] = -1.5;
  local_68.m_data[1] = -2.0;
  local_68.m_data[2] = 1.7;
  local_68.m_data[3] = -1.5;
  local_78.m_data[0] = 2.0;
  local_78.m_data[1] = 1.5;
  local_78.m_data[2] = -1.0;
  local_78.m_data[3] = 2.0;
  iVar2 = (this->super_TextureCubeArraySpecCase).m_size;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,this_01,iVar2,iVar2,(this->super_TextureCubeArraySpecCase).m_depth,rowPitch,
             slicePitch,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::fillWithComponentGradients(&local_58,&local_68,&local_78);
  this_00 = &(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806e,iVar1);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,iVar1);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806d,0);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,0);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,0);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,4);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  iVar1 = (this->super_TextureCubeArraySpecCase).m_size;
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x9009,0,*(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4,iVar1,iVar1
             ,(this->super_TextureCubeArraySpecCase).m_depth,0,TVar3.format,TVar3.dataType,
             (void *)0x0);
  sglr::ContextWrapper::glDeleteBuffers(this_00,1,&buf);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_size;
		int						alignment		= 4;
		int						rowPitch		= deAlign32(rowLength*pixelSize, alignment);
		int						imageHeight		= m_size;
		int						slicePitch		= imageHeight*rowPitch;
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(slicePitch*m_depth);
		{
			const Vec4 gMin = Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4 gMax = Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, m_depth, rowPitch, slicePitch, &data[0]), gMin, gMax);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	0);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		0);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	0);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_internalFormat, m_size, m_size, m_depth, 0, transferFmt.format, transferFmt.dataType, DE_NULL);
		glDeleteBuffers(1, &buf);
	}